

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utxo_snapshot.h
# Opt level: O0

void __thiscall node::SnapshotMetadata::Serialize<AutoFile>(SnapshotMetadata *this,AutoFile *s)

{
  long lVar1;
  AutoFile *in_RSI;
  uint256 *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AutoFile::operator<<(in_RSI,(array<unsigned_char,_5UL> *)in_RDI);
  AutoFile::operator<<(in_RSI,(unsigned_short *)in_RDI);
  AutoFile::operator<<(in_RSI,(array<unsigned_char,_4UL> *)in_RDI);
  AutoFile::operator<<(in_RSI,in_RDI);
  AutoFile::operator<<(in_RSI,(unsigned_long *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void Serialize(Stream& s) const {
        s << SNAPSHOT_MAGIC_BYTES;
        s << VERSION;
        s << m_network_magic;
        s << m_base_blockhash;
        s << m_coins_count;
    }